

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlNodeSetPtr val1;
  xmlChar *pxVar2;
  xmlNodeSetPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  long lVar5;
  int iVar6;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar6 = ctxt->valueNr;
    if ((long)iVar6 < 1) {
      iVar6 = 0x17;
    }
    else {
      iVar1 = iVar6 + -1;
      ctxt->valueNr = iVar1;
      if (iVar6 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ctxt->valueTab[(long)iVar6 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ctxt->valueTab[iVar1];
      ctxt->valueTab[iVar1] = (xmlXPathObjectPtr)0x0;
      if (pxVar4 != (xmlXPathObjectPtr)0x0) {
        if ((pxVar4->type | XPATH_USERS) == XPATH_XSLT_TREE) {
          val1 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
          if (val1 == (xmlNodeSetPtr)0x0) {
            val1 = (xmlNodeSetPtr)0x0;
          }
          else {
            val1->nodeNr = 0;
            val1->nodeMax = 0;
            val1->nodeTab = (xmlNodePtr *)0x0;
          }
          if (val1 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          if ((pxVar4->nodesetval != (xmlNodeSetPtr)0x0) &&
             (pxVar3 = pxVar4->nodesetval, 0 < pxVar3->nodeNr)) {
            lVar5 = 0;
            do {
              pxVar2 = xmlNodeGetContent(pxVar3->nodeTab[lVar5]);
              if (pxVar2 == (xmlChar *)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              pxVar3 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar2);
              if (pxVar3 == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              val1 = xmlXPathNodeSetMerge(val1,pxVar3);
              if (val1 == (xmlNodeSetPtr)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              xmlXPathFreeNodeSet(pxVar3);
              if (pxVar2 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar2);
              }
              lVar5 = lVar5 + 1;
              pxVar3 = pxVar4->nodesetval;
            } while (lVar5 < pxVar3->nodeNr);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar4);
        }
        else {
          pxVar2 = xmlXPathCastToString(pxVar4);
          if (pxVar2 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar4);
          val1 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar2);
          if (val1 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
          (*xmlFree)(pxVar2);
        }
        pxVar4 = xmlXPathCacheWrapNodeSet(ctxt,val1);
        xmlXPathValuePush(ctxt,pxVar4);
        return;
      }
      iVar6 = 10;
    }
  }
  else {
    iVar6 = 0xc;
  }
  xmlXPathErr(ctxt,iVar6);
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = xmlXPathValuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

	ret = xmlXPathNodeSetCreate(NULL);
        if (ret == NULL)
            xmlXPathPErrMemory(ctxt);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
                if (tokens == NULL)
                    xmlXPathPErrMemory(ctxt);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                if (ns == NULL)
                    xmlXPathPErrMemory(ctxt);
		ret = xmlXPathNodeSetMerge(ret, ns);
                if (ret == NULL)
                    xmlXPathPErrMemory(ctxt);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
	return;
    }
    tokens = xmlXPathCastToString(obj);
    if (tokens == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlXPathReleaseObject(ctxt->context, obj);
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    xmlFree(tokens);
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt, ret));
}